

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# response_parser.cc
# Opt level: O0

Response * __thiscall
iqxmlrpc::ResponseBuilder::get(Response *__return_storage_ptr__,ResponseBuilder *this)

{
  int fcode;
  bool bVar1;
  Value *this_00;
  reference_type v;
  reference_type fstring;
  XML_RPC_violation *this_01;
  allocator<char> local_59;
  string local_58;
  ResponseBuilder *local_28;
  ResponseBuilder *this_local;
  optional<iqxmlrpc::Value> *local_18;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_10;
  
  local_18 = &this->ok_;
  local_28 = this;
  this_local = (ResponseBuilder *)__return_storage_ptr__;
  bVar1 = boost::optional<iqxmlrpc::Value>::operator!(local_18);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    local_10 = &this->fault_str_;
    bVar1 = boost::
            optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator!(local_10);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      this_01 = (XML_RPC_violation *)__cxa_allocate_exception(0x18);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_58,"No valid response was found",&local_59);
      XML_RPC_violation::XML_RPC_violation(this_01,&local_58);
      __cxa_throw(this_01,&XML_RPC_violation::typeinfo,XML_RPC_violation::~XML_RPC_violation);
    }
    fcode = this->fault_code_;
    fstring = boost::
              optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::get(&this->fault_str_);
    Response::Response(__return_storage_ptr__,fcode,fstring);
  }
  else {
    this_00 = (Value *)operator_new(0x10);
    v = boost::optional<iqxmlrpc::Value>::get(&this->ok_);
    Value::Value(this_00,v);
    Response::Response(__return_storage_ptr__,this_00);
  }
  return __return_storage_ptr__;
}

Assistant:

Response
ResponseBuilder::get()
{
  if (ok_)
    return Response(new Value(ok_.get()));

  if (fault_str_)
    return Response(fault_code_, fault_str_.get());

  throw XML_RPC_violation("No valid response was found");
}